

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

Node * __thiscall anon_unknown.dwarf_4afdb9::Db::parseSubstitution(Db *this)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  Node **ppNVar6;
  Node *N;
  Node *pNVar7;
  undefined1 *Index;
  int iVar8;
  Node *WithTags;
  undefined8 local_30;
  
  pcVar3 = this->First;
  pcVar4 = this->Last;
  if (pcVar3 != pcVar4) {
    iVar8 = 0;
    if (*pcVar3 != 'S') {
      return (Node *)0x0;
    }
    pcVar1 = pcVar3 + 1;
    this->First = pcVar1;
    if (pcVar4 != pcVar1) {
      iVar8 = (int)*pcVar1;
    }
    iVar8 = islower(iVar8);
    if (iVar8 == 0) {
      if ((pcVar4 == pcVar1) || (*pcVar1 != '_')) {
        local_30 = (Node *)0x0;
        bVar5 = parseSeqId(this,&local_30);
        if ((!bVar5) && ((pcVar3 = this->First, pcVar3 != this->Last && (*pcVar3 == '_')))) {
          Index = (undefined1 *)((long)&local_30->_vptr_Node + 1);
          this->First = pcVar3 + 1;
          if (Index < (undefined1 *)((long)(this->Subs).Last - (long)(this->Subs).First >> 3))
          goto LAB_001990f8;
        }
      }
      else {
        this->First = pcVar3 + 2;
        if ((this->Subs).First != (this->Subs).Last) {
          Index = (undefined1 *)0x0;
LAB_001990f8:
          ppNVar6 = PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::operator[]
                              (&this->Subs,(size_t)Index);
          return *ppNVar6;
        }
      }
    }
    else if (pcVar4 != pcVar1) {
      cVar2 = *pcVar1;
      switch(cVar2) {
      case 'a':
        this->First = pcVar3 + 2;
        local_30 = (Node *)((ulong)local_30._4_4_ << 0x20);
        break;
      case 'b':
        this->First = pcVar3 + 2;
        local_30 = (Node *)CONCAT44(local_30._4_4_,1);
        break;
      case 'c':
      case 'e':
      case 'f':
      case 'g':
      case 'h':
        return (Node *)0x0;
      case 'd':
        this->First = pcVar3 + 2;
        local_30 = (Node *)CONCAT44(local_30._4_4_,5);
        break;
      case 'i':
        this->First = pcVar3 + 2;
        local_30 = (Node *)CONCAT44(local_30._4_4_,3);
        break;
      default:
        if (cVar2 == 'o') {
          this->First = pcVar3 + 2;
          local_30 = (Node *)CONCAT44(local_30._4_4_,4);
        }
        else {
          if (cVar2 != 's') {
            return (Node *)0x0;
          }
          this->First = pcVar3 + 2;
          local_30 = (Node *)CONCAT44(local_30._4_4_,2);
        }
      }
      N = &(anonymous_namespace)::Db::
           make<(anonymous_namespace)::SpecialSubstitution,(anonymous_namespace)::SpecialSubKind>
                     ((Db *)this,(SpecialSubKind *)&local_30)->super_Node;
      pNVar7 = parseAbiTags(this,N);
      if (pNVar7 == N) {
        return N;
      }
      local_30 = pNVar7;
      PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back(&this->Subs,(Node **)&local_30)
      ;
      return pNVar7;
    }
  }
  return (Node *)0x0;
}

Assistant:

bool consumeIf(char C) {
    if (First != Last && *First == C) {
      ++First;
      return true;
    }
    return false;
  }